

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_hkdf_expand_label
              (ptls_hash_algorithm_t *algo,void *output,size_t outlen,ptls_iovec_t secret,
              char *label,ptls_iovec_t hash_value,char *base_label)

{
  ptls_iovec_t info;
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  undefined1 local_29a;
  undefined1 local_299;
  ptls_buffer_t hkdf_label;
  uint8_t hkdf_label_buf [512];
  
  hkdf_label.base = hkdf_label_buf;
  hkdf_label.off = 0;
  hkdf_label.capacity = 0x200;
  hkdf_label.is_allocated = 0;
  local_29a = (undefined1)(outlen >> 8);
  local_299 = (undefined1)outlen;
  iVar2 = ptls_buffer__do_pushv(&hkdf_label,&local_29a,2);
  if (iVar2 == 0) {
    iVar2 = ptls_buffer__do_pushv(&hkdf_label,"",1);
    sVar1 = hkdf_label.off;
    if (iVar2 == 0) {
      __s = "tls13 ";
      if (base_label != (char *)0x0) {
        __s = base_label;
      }
      sVar3 = strlen(__s);
      iVar2 = ptls_buffer__do_pushv(&hkdf_label,__s,sVar3);
      if (iVar2 == 0) {
        sVar3 = strlen(label);
        iVar2 = ptls_buffer__do_pushv(&hkdf_label,label,sVar3);
        if (iVar2 == 0) {
          hkdf_label.base[sVar1 - 1] = (char)hkdf_label.off - (char)sVar1;
          iVar2 = ptls_buffer__do_pushv(&hkdf_label,"",1);
          sVar1 = hkdf_label.off;
          if (iVar2 == 0) {
            iVar2 = ptls_buffer__do_pushv(&hkdf_label,hash_value.base,hash_value.len);
            if (iVar2 == 0) {
              hkdf_label.base[sVar1 - 1] = (char)hkdf_label.off - (char)sVar1;
              info.len = hkdf_label.off;
              info.base = hkdf_label.base;
              iVar2 = ptls_hkdf_expand(algo,output,outlen,secret,info);
            }
          }
        }
      }
    }
  }
  ptls_buffer_dispose(&hkdf_label);
  return iVar2;
}

Assistant:

int ptls_hkdf_expand_label(ptls_hash_algorithm_t *algo, void *output, size_t outlen, ptls_iovec_t secret, const char *label,
                           ptls_iovec_t hash_value, const char *base_label)
{
    ptls_buffer_t hkdf_label;
    uint8_t hkdf_label_buf[512];
    int ret;

    ptls_buffer_init(&hkdf_label, hkdf_label_buf, sizeof(hkdf_label_buf));

    ptls_buffer_push16(&hkdf_label, (uint16_t)outlen);
    ptls_buffer_push_block(&hkdf_label, 1, {
        if (base_label == NULL)
            base_label = "tls13 ";
        ptls_buffer_pushv(&hkdf_label, base_label, strlen(base_label));
        ptls_buffer_pushv(&hkdf_label, label, strlen(label));
    });
    ptls_buffer_push_block(&hkdf_label, 1, { ptls_buffer_pushv(&hkdf_label, hash_value.base, hash_value.len); });

    ret = ptls_hkdf_expand(algo, output, outlen, secret, ptls_iovec_init(hkdf_label.base, hkdf_label.off));

Exit:
    ptls_buffer_dispose(&hkdf_label);
    return ret;
}